

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  _sg_buffer_t *buf_00;
  _sg_buffer_t *buf;
  sg_buffer_desc desc_def;
  sg_buffer_desc *desc_local;
  sg_buffer buf_id_local;
  
  desc_def._88_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3df6,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
  }
  _sg_buffer_desc_defaults((sg_buffer_desc *)&buf,desc);
  buf_00 = _sg_lookup_buffer(&_sg.pools,buf_id.id);
  if (buf_00 != (_sg_buffer_t *)0x0) {
    if ((buf_00->slot).state == SG_RESOURCESTATE_ALLOC) {
      _sg_init_buffer(buf_00,(sg_buffer_desc *)&buf);
      if (((buf_00->slot).state != SG_RESOURCESTATE_VALID) &&
         ((buf_00->slot).state != SG_RESOURCESTATE_FAILED)) {
        __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                      ,0x3dfc,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
      }
    }
    else {
      _sg_log("sg_init_buffer: buffer must be in alloc state\n");
    }
  }
  return;
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }